

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall VW::ptr_queue<example>::push(ptr_queue<example> *this,example *item)

{
  size_type sVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_38;
  example *local_28;
  
  local_28 = item;
  std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->mut);
  while( true ) {
    sVar1 = std::deque<example_*,_std::allocator<example_*>_>::size(&(this->object_queue).c);
    if (sVar1 != this->max_size) break;
    std::condition_variable::wait((unique_lock *)&this->is_not_full);
  }
  std::deque<example_*,_std::allocator<example_*>_>::push_back(&(this->object_queue).c,&local_28);
  std::unique_lock<std::mutex>::unlock(&uStack_38);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return;
}

Assistant:

void push(T* item)
    {
      std::unique_lock<std::mutex> lock(mut);
      while (object_queue.size() == max_size)
      {
        is_not_full.wait(lock);
      }

      object_queue.push(item);

      lock.unlock();
      is_not_empty.notify_all();
    }